

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Daemon.cpp
# Opt level: O3

Response execute_command(DatasetDropCommand *cmd,Task *task,DatabaseSnapshot *snap)

{
  Response RVar1;
  DbChangeType local_9c;
  string local_98;
  DBChange local_78;
  
  local_9c = Drop;
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"");
  DBChange::DBChange(&local_78,&local_9c,(string *)task,&local_98);
  std::vector<DBChange,_std::allocator<DBChange>_>::emplace_back<DBChange>
            ((vector<DBChange,_std::allocator<DBChange>_> *)
             &(snap->db_name)._M_pathname._M_string_length,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.parameter._M_dataplus._M_p != &local_78.parameter.field_2) {
    operator_delete(local_78.parameter._M_dataplus._M_p,
                    local_78.parameter.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.obj_name._M_dataplus._M_p != &local_78.obj_name.field_2) {
    operator_delete(local_78.obj_name._M_dataplus._M_p,
                    local_78.obj_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  RVar1 = Response::ok();
  RVar1.content._0_8_ = cmd;
  return (Response)RVar1.content;
}

Assistant:

Response execute_command(const DatasetDropCommand &cmd, Task *task,
                         [[maybe_unused]] const DatabaseSnapshot *snap) {
    task->change(DBChange(DbChangeType::Drop, cmd.dataset_id()));

    return Response::ok();
}